

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * kwssys::SystemTools::SplitPathRootComponent(string *p,string *root)

{
  char cVar1;
  char *pcVar2;
  string *in_RSI;
  bool bVar3;
  size_t n;
  char *c;
  long local_20;
  char *local_18;
  
  local_18 = (char *)std::__cxx11::string::c_str();
  if (((*local_18 == '/') && (local_18[1] == '/')) || ((*local_18 == '\\' && (local_18[1] == '\\')))
     ) {
    if (in_RSI != (string *)0x0) {
      std::__cxx11::string::operator=(in_RSI,"//");
    }
    local_18 = local_18 + 2;
  }
  else if ((*local_18 == '/') || (*local_18 == '\\')) {
    if (in_RSI != (string *)0x0) {
      std::__cxx11::string::operator=(in_RSI,"/");
    }
    local_18 = local_18 + 1;
  }
  else if (((*local_18 == '\0') || (local_18[1] != ':')) ||
          ((local_18[2] != '/' && (local_18[2] != '\\')))) {
    if ((*local_18 == '\0') || (local_18[1] != ':')) {
      if (*local_18 == '~') {
        local_20 = 1;
        while( true ) {
          bVar3 = false;
          if (local_18[local_20] != '\0') {
            bVar3 = local_18[local_20] != '/';
          }
          if (!bVar3) break;
          local_20 = local_20 + 1;
        }
        if (in_RSI != (string *)0x0) {
          std::__cxx11::string::assign((char *)in_RSI,(ulong)local_18);
          std::__cxx11::string::operator+=(in_RSI,'/');
        }
        if (local_18[local_20] == '/') {
          local_20 = local_20 + 1;
        }
        local_18 = local_18 + local_20;
      }
      else if (in_RSI != (string *)0x0) {
        std::__cxx11::string::operator=(in_RSI,"");
      }
    }
    else {
      if (in_RSI != (string *)0x0) {
        std::__cxx11::string::operator=(in_RSI,"_:");
        cVar1 = *local_18;
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
        *pcVar2 = cVar1;
      }
      local_18 = local_18 + 2;
    }
  }
  else {
    if (in_RSI != (string *)0x0) {
      std::__cxx11::string::operator=(in_RSI,"_:/");
      cVar1 = *local_18;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
      *pcVar2 = cVar1;
    }
    local_18 = local_18 + 3;
  }
  return local_18;
}

Assistant:

const char* SystemTools::SplitPathRootComponent(const std::string& p,
                                                std::string* root)
{
  // Identify the root component.
  const char* c = p.c_str();
  if ((c[0] == '/' && c[1] == '/') || (c[0] == '\\' && c[1] == '\\')) {
    // Network path.
    if (root) {
      *root = "//";
    }
    c += 2;
  } else if (c[0] == '/' || c[0] == '\\') {
    // Unix path (or Windows path w/out drive letter).
    if (root) {
      *root = "/";
    }
    c += 1;
  } else if (c[0] && c[1] == ':' && (c[2] == '/' || c[2] == '\\')) {
    // Windows path.
    if (root) {
      (*root) = "_:/";
      (*root)[0] = c[0];
    }
    c += 3;
  } else if (c[0] && c[1] == ':') {
    // Path relative to a windows drive working directory.
    if (root) {
      (*root) = "_:";
      (*root)[0] = c[0];
    }
    c += 2;
  } else if (c[0] == '~') {
    // Home directory.  The returned root should always have a
    // trailing slash so that appending components as
    // c[0]c[1]/c[2]/... works.  The remaining path returned should
    // skip the first slash if it exists:
    //
    //   "~"    : root = "~/" , return ""
    //   "~/    : root = "~/" , return ""
    //   "~/x   : root = "~/" , return "x"
    //   "~u"   : root = "~u/", return ""
    //   "~u/"  : root = "~u/", return ""
    //   "~u/x" : root = "~u/", return "x"
    size_t n = 1;
    while (c[n] && c[n] != '/') {
      ++n;
    }
    if (root) {
      root->assign(c, n);
      *root += '/';
    }
    if (c[n] == '/') {
      ++n;
    }
    c += n;
  } else {
    // Relative path.
    if (root) {
      *root = "";
    }
  }

  // Return the remaining path.
  return c;
}